

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

void __thiscall FString::ReplaceChars(FString *this,char oldchar,char newchar)

{
  uint uVar1;
  ulong uVar2;
  
  LockBuffer(this);
  uVar1 = *(uint *)(this->Chars + -0xc);
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    if (this->Chars[uVar2] == oldchar) {
      this->Chars[uVar2] = newchar;
    }
  }
  UnlockBuffer(this);
  return;
}

Assistant:

void FString::ReplaceChars (char oldchar, char newchar)
{
	size_t i, j;

	LockBuffer();
	for (i = 0, j = Len(); i < j; ++i)
	{
		if (Chars[i] == oldchar)
		{
			Chars[i] = newchar;
		}
	}
	UnlockBuffer();
}